

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall QPDFLogger::info(QPDFLogger *this,string *s)

{
  element_type *this_00;
  shared_ptr<Pipeline> local_28;
  string *local_18;
  string *s_local;
  QPDFLogger *this_local;
  
  local_18 = s;
  s_local = (string *)this;
  getInfo((QPDFLogger *)&local_28,SUB81(this,0));
  this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_28);
  Pipeline::writeString(this_00,local_18);
  std::shared_ptr<Pipeline>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
QPDFLogger::info(std::string const& s)
{
    getInfo(false)->writeString(s);
}